

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall_file.cpp
# Opt level: O0

void __thiscall
foxxll::syscall_file::serve
          (syscall_file *this,void *buffer,offset_type offset,size_type bytes,read_or_write op)

{
  __off64_t _Var1;
  ostream *poVar2;
  int *piVar3;
  io_error *piVar4;
  ssize_t sVar5;
  offset_type oVar6;
  char *pcVar7;
  string local_548;
  ostringstream local_528 [8];
  ostringstream msg_2;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream msg_1;
  string local_208;
  ostringstream local_1e8 [8];
  ostringstream msg;
  off_t rc;
  undefined1 local_58 [8];
  scoped_read_write_timer read_write_timer;
  char *cbuffer;
  unique_lock<std::mutex> fd_lock;
  size_type sStack_28;
  read_or_write op_local;
  size_type bytes_local;
  offset_type offset_local;
  void *buffer_local;
  syscall_file *this_local;
  
  fd_lock._12_4_ = op;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&cbuffer,&(this->super_ufs_file_base).fd_mutex_);
  read_write_timer._8_8_ = buffer;
  file_stats::scoped_read_write_timer::scoped_read_write_timer
            ((scoped_read_write_timer *)local_58,*(file_stats **)&this->field_0x88,bytes,
             fd_lock._12_4_ == 1);
  sStack_28 = bytes;
  bytes_local = offset;
  while( true ) {
    if (sStack_28 == 0) {
      file_stats::scoped_read_write_timer::~scoped_read_write_timer
                ((scoped_read_write_timer *)local_58);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&cbuffer);
      return;
    }
    _Var1 = lseek64((this->super_ufs_file_base).file_des_,bytes_local,0);
    if (_Var1 < 0) break;
    if (fd_lock._12_4_ == 0) {
      sVar5 = read((this->super_ufs_file_base).file_des_,(void *)read_write_timer._8_8_,sStack_28);
      if (sVar5 < 1) {
        std::__cxx11::ostringstream::ostringstream(local_388);
        poVar2 = std::operator<<((ostream *)local_388,"Error in ");
        poVar2 = std::operator<<(poVar2,
                                 "virtual void foxxll::syscall_file::serve(void *, offset_type, size_type, request::read_or_write)"
                                );
        poVar2 = std::operator<<(poVar2," : ");
        poVar2 = std::operator<<(poVar2," this=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
        poVar2 = std::operator<<(poVar2," call=::read(fd,buffer,bytes)");
        poVar2 = std::operator<<(poVar2," path=");
        poVar2 = std::operator<<(poVar2,(string *)&(this->super_ufs_file_base).filename_);
        poVar2 = std::operator<<(poVar2," fd=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_ufs_file_base).file_des_);
        poVar2 = std::operator<<(poVar2," offset=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,bytes_local);
        poVar2 = std::operator<<(poVar2," buffer=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,buffer);
        poVar2 = std::operator<<(poVar2," bytes=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sStack_28);
        poVar2 = std::operator<<(poVar2," op=");
        poVar2 = std::operator<<(poVar2,"READ");
        poVar2 = std::operator<<(poVar2," rc=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar5);
        poVar2 = std::operator<<(poVar2," : ");
        piVar3 = __errno_location();
        pcVar7 = strerror(*piVar3);
        std::operator<<(poVar2,pcVar7);
        piVar4 = (io_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::ostringstream::str();
        io_error::io_error(piVar4,&local_3a8);
        __cxa_throw(piVar4,&io_error::typeinfo,io_error::~io_error);
      }
      sStack_28 = sStack_28 - sVar5;
      bytes_local = sVar5 + bytes_local;
      read_write_timer._8_8_ = sVar5 + read_write_timer._8_8_;
      if ((sStack_28 != 0) &&
         (oVar6 = ufs_file_base::_size(&this->super_ufs_file_base), bytes_local == oVar6)) {
        memset((void *)read_write_timer._8_8_,0,sStack_28);
        sStack_28 = 0;
      }
    }
    else {
      sVar5 = write((this->super_ufs_file_base).file_des_,(void *)read_write_timer._8_8_,sStack_28);
      if (sVar5 < 1) {
        std::__cxx11::ostringstream::ostringstream(local_528);
        poVar2 = std::operator<<((ostream *)local_528,"Error in ");
        poVar2 = std::operator<<(poVar2,
                                 "virtual void foxxll::syscall_file::serve(void *, offset_type, size_type, request::read_or_write)"
                                );
        poVar2 = std::operator<<(poVar2," : ");
        poVar2 = std::operator<<(poVar2," this=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
        poVar2 = std::operator<<(poVar2," call=::write(fd,buffer,bytes)");
        poVar2 = std::operator<<(poVar2," path=");
        poVar2 = std::operator<<(poVar2,(string *)&(this->super_ufs_file_base).filename_);
        poVar2 = std::operator<<(poVar2," fd=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_ufs_file_base).file_des_);
        poVar2 = std::operator<<(poVar2," offset=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,bytes_local);
        poVar2 = std::operator<<(poVar2," buffer=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,buffer);
        poVar2 = std::operator<<(poVar2," bytes=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sStack_28);
        poVar2 = std::operator<<(poVar2," op=");
        poVar2 = std::operator<<(poVar2,"WRITE");
        poVar2 = std::operator<<(poVar2," rc=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar5);
        poVar2 = std::operator<<(poVar2," : ");
        piVar3 = __errno_location();
        pcVar7 = strerror(*piVar3);
        std::operator<<(poVar2,pcVar7);
        piVar4 = (io_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::ostringstream::str();
        io_error::io_error(piVar4,&local_548);
        __cxa_throw(piVar4,&io_error::typeinfo,io_error::~io_error);
      }
      sStack_28 = sStack_28 - sVar5;
      bytes_local = sVar5 + bytes_local;
      read_write_timer._8_8_ = sVar5 + read_write_timer._8_8_;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_1e8);
  poVar2 = std::operator<<((ostream *)local_1e8,"Error in ");
  poVar2 = std::operator<<(poVar2,
                           "virtual void foxxll::syscall_file::serve(void *, offset_type, size_type, request::read_or_write)"
                          );
  poVar2 = std::operator<<(poVar2," : ");
  poVar2 = std::operator<<(poVar2," this=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
  poVar2 = std::operator<<(poVar2," call=::lseek(fd,offset,SEEK_SET)");
  poVar2 = std::operator<<(poVar2," path=");
  poVar2 = std::operator<<(poVar2,(string *)&(this->super_ufs_file_base).filename_);
  poVar2 = std::operator<<(poVar2," fd=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_ufs_file_base).file_des_);
  poVar2 = std::operator<<(poVar2," offset=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bytes_local);
  poVar2 = std::operator<<(poVar2," buffer=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(void *)read_write_timer._8_8_);
  poVar2 = std::operator<<(poVar2," bytes=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sStack_28);
  poVar2 = std::operator<<(poVar2," op=");
  pcVar7 = "WRITE";
  if (fd_lock._12_4_ == 0) {
    pcVar7 = "READ";
  }
  poVar2 = std::operator<<(poVar2,pcVar7);
  poVar2 = std::operator<<(poVar2," rc=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2," : ");
  piVar3 = __errno_location();
  pcVar7 = strerror(*piVar3);
  std::operator<<(poVar2,pcVar7);
  piVar4 = (io_error *)__cxa_allocate_exception(0x20);
  std::__cxx11::ostringstream::str();
  io_error::io_error(piVar4,&local_208);
  __cxa_throw(piVar4,&io_error::typeinfo,io_error::~io_error);
}

Assistant:

void syscall_file::serve(void* buffer, offset_type offset, size_type bytes,
                         request::read_or_write op)
{
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);

    auto* cbuffer = static_cast<char*>(buffer);

    file_stats::scoped_read_write_timer read_write_timer(
        file_stats_, bytes, op == request::WRITE);

    while (bytes > 0)
    {
        off_t rc = ::lseek(file_des_, offset, SEEK_SET);
        if (rc < 0)
        {
            FOXXLL_THROW_ERRNO(
                io_error,
                " this=" << this <<
                    " call=::lseek(fd,offset,SEEK_SET)" <<
                    " path=" << filename_ <<
                    " fd=" << file_des_ <<
                    " offset=" << offset <<
                    " buffer=" << static_cast<void*>(cbuffer) <<
                    " bytes=" << bytes <<
                    " op=" << ((op == request::READ) ? "READ" : "WRITE") <<
                    " rc=" << rc
            );
        }

        if (op == request::READ)
        {
#if FOXXLL_MSVC
            assert(bytes <= std::numeric_limits<unsigned int>::max());
            if ((rc = ::read(file_des_, cbuffer, (unsigned int)bytes)) <= 0)
#else
            if ((rc = ::read(file_des_, cbuffer, bytes)) <= 0)
#endif
            {
                FOXXLL_THROW_ERRNO(
                    io_error,
                    " this=" << this <<
                        " call=::read(fd,buffer,bytes)" <<
                        " path=" << filename_ <<
                        " fd=" << file_des_ <<
                        " offset=" << offset <<
                        " buffer=" << static_cast<void*>(buffer) <<
                        " bytes=" << bytes <<
                        " op=" << "READ" <<
                        " rc=" << rc
                );
            }
            bytes = static_cast<size_type>(bytes - rc);
            offset += rc;
            cbuffer += rc;

            if (bytes > 0 && offset == this->_size())
            {
                // read request extends past end-of-file
                // fill reminder with zeroes
                memset(cbuffer, 0, bytes);
                bytes = 0;
            }
        }
        else
        {
#if FOXXLL_MSVC
            assert(bytes <= std::numeric_limits<unsigned int>::max());
            if ((rc = ::write(file_des_, cbuffer, (unsigned int)bytes)) <= 0)
#else
            if ((rc = ::write(file_des_, cbuffer, bytes)) <= 0)
#endif
            {
                FOXXLL_THROW_ERRNO(
                    io_error,
                    " this=" << this <<
                        " call=::write(fd,buffer,bytes)" <<
                        " path=" << filename_ <<
                        " fd=" << file_des_ <<
                        " offset=" << offset <<
                        " buffer=" << static_cast<void*>(buffer) <<
                        " bytes=" << bytes <<
                        " op=" << "WRITE" <<
                        " rc=" << rc
                );
            }
            bytes = static_cast<size_type>(bytes - rc);
            offset += rc;
            cbuffer += rc;
        }
    }
}